

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FListMenuItem_*,_FListMenuItem_*>::~TDeletingArray
          (TDeletingArray<FListMenuItem_*,_FListMenuItem_*> *this)

{
  uint uVar1;
  FListMenuItem **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FListMenuItem_*,_FListMenuItem_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FListMenuItem_*,_FListMenuItem_*>::Size
                        (&this->super_TArray<FListMenuItem_*,_FListMenuItem_*>), local_14 < uVar1;
      local_14 = local_14 + 1) {
    ppFVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                        (&this->super_TArray<FListMenuItem_*,_FListMenuItem_*>,(ulong)local_14);
    if (*ppFVar2 != (FListMenuItem *)0x0) {
      ppFVar2 = TArray<FListMenuItem_*,_FListMenuItem_*>::operator[]
                          (&this->super_TArray<FListMenuItem_*,_FListMenuItem_*>,(ulong)local_14);
      if (*ppFVar2 != (FListMenuItem *)0x0) {
        (*(*ppFVar2)->_vptr_FListMenuItem[1])();
      }
    }
  }
  TArray<FListMenuItem_*,_FListMenuItem_*>::~TArray
            (&this->super_TArray<FListMenuItem_*,_FListMenuItem_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}